

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O0

void __thiscall
opengv::absolute_pose::modules::Epnp::compute_L_6x10
          (Epnp *this,MatrixXd *Ut,Matrix<double,_6,_10,_0,_6,_10> *L_6x10)

{
  CoeffReturnType pdVar1;
  Scalar *pSVar2;
  Epnp *in_RDI;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_1> *this_00;
  double dVar3;
  int i_1;
  int j;
  int b;
  int a;
  int i;
  double dv [4] [6] [3];
  Index in_stack_fffffffffffffd18;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *in_stack_fffffffffffffd20;
  int local_26c;
  int local_268;
  int local_264;
  int local_260;
  int local_25c;
  double local_258 [18];
  double adStack_1c8 [18];
  double adStack_138 [18];
  double adStack_a8 [21];
  
  for (local_25c = 0; local_25c < 4; local_25c = local_25c + 1) {
    local_260 = 0;
    local_264 = 1;
    for (local_268 = 0; local_268 < 6; local_268 = local_268 + 1) {
      pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0x9041bb);
      dVar3 = *pdVar1;
      pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0x9041ec);
      local_258[(long)local_25c * 0x12 + (long)local_268 * 3] = dVar3 - *pdVar1;
      pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0x90424d);
      dVar3 = *pdVar1;
      pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0x904281);
      local_258[(long)local_25c * 0x12 + (long)local_268 * 3 + 1] = dVar3 - *pdVar1;
      pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0x9042e3);
      dVar3 = *pdVar1;
      pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0x904317);
      local_258[(long)local_25c * 0x12 + (long)local_268 * 3 + 2] = dVar3 - *pdVar1;
      local_264 = local_264 + 1;
      if (3 < local_264) {
        local_264 = local_260 + 2;
        local_260 = local_260 + 1;
      }
    }
  }
  for (local_26c = 0; local_26c < 6; local_26c = local_26c + 1) {
    this_00 = (DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_1> *)
              dot(in_RDI,local_258 + (long)local_26c * 3,local_258 + (long)local_26c * 3);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_1>::operator()
                       (this_00,in_stack_fffffffffffffd18,0x90441d);
    *pSVar2 = (Scalar)this_00;
    dVar3 = dot(in_RDI,local_258 + (long)local_26c * 3,adStack_1c8 + (long)local_26c * 3);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_1>::operator()
                       (this_00,in_stack_fffffffffffffd18,0x90448d);
    *pSVar2 = dVar3 * 2.0;
    dVar3 = dot(in_RDI,adStack_1c8 + (long)local_26c * 3,adStack_1c8 + (long)local_26c * 3);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_1>::operator()
                       (this_00,in_stack_fffffffffffffd18,0x9044f4);
    *pSVar2 = dVar3;
    dVar3 = dot(in_RDI,local_258 + (long)local_26c * 3,adStack_138 + (long)local_26c * 3);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_1>::operator()
                       (this_00,in_stack_fffffffffffffd18,0x904564);
    *pSVar2 = dVar3 * 2.0;
    dVar3 = dot(in_RDI,adStack_1c8 + (long)local_26c * 3,adStack_138 + (long)local_26c * 3);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_1>::operator()
                       (this_00,in_stack_fffffffffffffd18,0x9045db);
    *pSVar2 = dVar3 * 2.0;
    dVar3 = dot(in_RDI,adStack_138 + (long)local_26c * 3,adStack_138 + (long)local_26c * 3);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_1>::operator()
                       (this_00,in_stack_fffffffffffffd18,0x904642);
    *pSVar2 = dVar3;
    dVar3 = dot(in_RDI,local_258 + (long)local_26c * 3,adStack_a8 + (long)local_26c * 3);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_1>::operator()
                       (this_00,in_stack_fffffffffffffd18,0x9046b2);
    *pSVar2 = dVar3 * 2.0;
    dVar3 = dot(in_RDI,adStack_1c8 + (long)local_26c * 3,adStack_a8 + (long)local_26c * 3);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_1>::operator()
                       (this_00,in_stack_fffffffffffffd18,0x904729);
    *pSVar2 = dVar3 * 2.0;
    dVar3 = dot(in_RDI,adStack_138 + (long)local_26c * 3,adStack_a8 + (long)local_26c * 3);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_1>::operator()
                       (this_00,in_stack_fffffffffffffd18,0x9047a0);
    *pSVar2 = dVar3 * 2.0;
    dVar3 = dot(in_RDI,adStack_a8 + (long)local_26c * 3,adStack_a8 + (long)local_26c * 3);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_1>::operator()
                       (this_00,in_stack_fffffffffffffd18,0x904807);
    *pSVar2 = dVar3;
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::compute_L_6x10(
    const Eigen::MatrixXd & Ut,
    Eigen::Matrix<double,6,10> & L_6x10 )
{
  double dv[4][6][3];

  for(int i = 0; i < 4; i++)
  {
    int a = 0, b = 1;
    for(int j = 0; j < 6; j++)
    {
      dv[i][j][0] = Ut(11-i,3 * a    ) - Ut(11-i,3 * b);
      dv[i][j][1] = Ut(11-i,3 * a + 1) - Ut(11-i,3 * b + 1);
      dv[i][j][2] = Ut(11-i,3 * a + 2) - Ut(11-i,3 * b + 2);

      b++;
      if (b > 3)
      {
        a++;
        b = a + 1;
      }
    }
  }

  for(int i = 0; i < 6; i++)
  {
    L_6x10(i,0) =        dot(dv[0][i], dv[0][i]);
    L_6x10(i,1) = 2.0f * dot(dv[0][i], dv[1][i]);
    L_6x10(i,2) =        dot(dv[1][i], dv[1][i]);
    L_6x10(i,3) = 2.0f * dot(dv[0][i], dv[2][i]);
    L_6x10(i,4) = 2.0f * dot(dv[1][i], dv[2][i]);
    L_6x10(i,5) =        dot(dv[2][i], dv[2][i]);
    L_6x10(i,6) = 2.0f * dot(dv[0][i], dv[3][i]);
    L_6x10(i,7) = 2.0f * dot(dv[1][i], dv[3][i]);
    L_6x10(i,8) = 2.0f * dot(dv[2][i], dv[3][i]);
    L_6x10(i,9) =        dot(dv[3][i], dv[3][i]);
  }
}